

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_StringLiteral.h
# Opt level: O0

void __thiscall psy::C::StringLiteral::~StringLiteral(StringLiteral *this)

{
  StringLiteral *this_local;
  
  ~StringLiteral(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

class PSY_C_API StringLiteral final : public Lexeme
{
public:
    //!@{
    /**
     * Cast \c this Lexeme as a StringLiteral.
     */
    virtual StringLiteral* asStringLiteral() override { return this; }
    virtual const StringLiteral* asStringLiteral() const override { return this; }

    /**
     * \brief The EncodingPrefix alternatives of a StringLiteral.
     */
    enum class EncodingPrefix : std::uint8_t
    {
        u8,
        u,
        U,
        L,
        None
    };

    /**
     * The EncodingPrefix of \c this StringLiteral.
     */
    EncodingPrefix encodingPrefix() const;

    // TODO: Make internal.
    StringLiteral(const char* chars, unsigned int size);
}